

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

string * __thiscall
nonius::detail::percentage_abi_cxx11_(string *__return_storage_ptr__,detail *this,double d)

{
  long lVar1;
  ostream *poVar2;
  double dVar3;
  ostringstream ss;
  long local_188;
  undefined8 local_180 [2];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  *(undefined8 *)((long)local_180 + *(long *)(local_188 + -0x18)) = 3;
  lVar1 = *(long *)(local_188 + -0x18);
  if ((d == 0.0) || (1e-05 <= d)) {
    *(uint *)((long)auStack_170 + lVar1) = *(uint *)((long)auStack_170 + lVar1) & 0xfffffefb;
    dVar3 = d * 100.0;
  }
  else {
    *(uint *)((long)auStack_170 + lVar1) = *(uint *)((long)auStack_170 + lVar1) & 0xfffffefb | 4;
    dVar3 = 0.0001;
  }
  poVar2 = std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"%",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

inline std::string percentage(double d) {
            std::ostringstream ss;
            ss << std::setprecision(3);
            if(d != 0 && d < 1e-5) {
                ss << std::fixed;
                ss << 0.0001 << "%";
            } else {
                ss.unsetf(std::ios::floatfield);
                ss << (100. * d) << "%";
            }
            return ss.str();
        }